

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O1

double __thiscall
HyperGraph::effic_inf_valid_algo(HyperGraph *this,Nodelist *vecSeed,double delta,double eps)

{
  ulong *puVar1;
  uint uVar2;
  uint *puVar3;
  pointer pvVar4;
  pointer ppVar5;
  _Bit_type *p_Var6;
  pointer puVar7;
  byte bVar8;
  bool bVar9;
  uint *puVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  HyperGraph *pHVar17;
  ulong uVar18;
  ulong uVar19;
  Nodelist *__range1;
  pointer ppVar20;
  long lVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar25;
  undefined1 auVar24 [16];
  double dVar26;
  vector<bool,_std::allocator<bool>_> vecBoolSeed;
  allocator_type local_a2;
  bool local_a1;
  ulong local_a0;
  HyperGraph *local_98;
  double dStack_90;
  undefined1 local_88 [16];
  long local_78;
  double local_70;
  ulong local_68;
  long local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_88._8_8_ = local_88._0_8_;
  local_98 = (HyperGraph *)((eps + 1.0) * 2.8731273138361804);
  local_88._0_8_ = eps;
  dVar22 = log(2.0 / delta);
  local_70 = (dVar22 * (double)local_98) / ((double)local_88._0_8_ * (double)local_88._0_8_) + 1.0;
  local_a1 = false;
  local_98 = this;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(ulong)this->__numV,&local_a1,&local_a2);
  puVar3 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar10 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start; puVar10 != puVar3; puVar10 = puVar10 + 1) {
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p[*puVar10 >> 6] =
         local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p[*puVar10 >> 6] | 1L << ((byte)*puVar10 & 0x3f);
  }
  dVar26 = 0.0;
  dStack_90 = 0.0;
  dVar22 = 0.0;
  dVar25 = 0.0;
  pHVar17 = local_98;
  if (0.0 < local_70) {
    local_88._0_8_ =
         local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    lVar11 = 0;
    lVar21 = 0;
    do {
      uVar2 = pHVar17->__numV;
      local_60 = lVar11;
      if (0x17d < dsfmt_global_data.idx) {
        dsfmt_gen_rand_all(&dsfmt_global_data);
        dsfmt_global_data.idx = 0;
        pHVar17 = local_98;
      }
      lVar11 = (long)dsfmt_global_data.idx;
      dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
      uVar19 = (ulong)*(uint *)((long)dsfmt_global_data.status + lVar11 * 8) % (ulong)uVar2;
      if ((*(ulong *)(local_88._0_8_ + (uVar19 >> 6) * 8) >> (uVar19 & 0x3f) & 1) == 0) {
        *(pHVar17->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start = (uint)uVar19;
        puVar1 = (pHVar17->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar19 >> 6);
        *puVar1 = *puVar1 | 1L << ((byte)uVar19 & 0x3f);
        uVar18 = 1;
        uVar19 = 0;
        do {
          uVar2 = (pHVar17->__vecVisitNode).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19];
          if (pHVar17->_cascadeModel == LT) {
            pvVar4 = (pHVar17->_graph->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (*(pointer *)
                 ((long)&pvVar4[uVar2].
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data + 8) ==
                pvVar4[uVar2].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar15 = 6;
            }
            else {
              if (0x17d < dsfmt_global_data.idx) {
                dsfmt_gen_rand_all(&dsfmt_global_data);
                dsfmt_global_data.idx = 0;
                pHVar17 = local_98;
              }
              lVar11 = (long)dsfmt_global_data.idx;
              dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
              dVar22 = 2.0 - dsfmt_global_data.status[0].d[lVar11];
              lVar11 = *(long *)&pvVar4[uVar2].
                                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data;
              if ((double)*(float *)(lVar11 + 4) <= dVar22) {
                ppVar20 = *(pointer *)
                           ((long)&pvVar4[uVar2].
                                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                   ._M_impl.super__Vector_impl_data + 8);
                lVar12 = (long)ppVar20 - lVar11 >> 3;
                if (dVar22 <= (double)ppVar20[-1].second) {
                  uVar13 = lVar12 - 1;
                  if (uVar13 != 0) {
                    uVar16 = 0;
                    uVar14 = uVar13;
                    do {
                      uVar13 = uVar14 + uVar16 >> 1;
                      if ((double)*(float *)(lVar11 + 4 + uVar13 * 8) < dVar22) {
                        uVar16 = uVar13 + 1;
                        uVar13 = uVar14;
                      }
                      uVar14 = uVar13;
                    } while (uVar16 < uVar13);
                  }
                }
                else {
                  uVar13 = lVar12 + 1;
                }
              }
              else {
                uVar13 = 0;
              }
              pvVar4 = (pHVar17->_graph->
                       super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              lVar11 = *(long *)&pvVar4[uVar2].
                                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data;
              uVar15 = 7;
              if (uVar13 < (ulong)((long)*(pointer *)
                                          ((long)&pvVar4[uVar2].
                                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - lVar11 >>
                                  3)) {
                uVar2 = *(uint *)(lVar11 + uVar13 * 8);
                p_Var6 = (pHVar17->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>.
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                uVar14 = 1L << ((byte)uVar2 & 0x3f);
                uVar16 = (ulong)(uVar2 >> 6);
                uVar13 = p_Var6[uVar16];
                if ((uVar13 >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00117cf4;
                if ((*(ulong *)(local_88._0_8_ + uVar16 * 8) & uVar14) != 0) {
                  lVar21 = lVar21 + 1;
                  uVar15 = 10;
                  goto LAB_00117cf4;
                }
                (pHVar17->__vecVisitNode).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar18] = uVar2;
                uVar18 = uVar18 + 1;
                p_Var6[uVar16] = uVar14 | uVar13;
                uVar15 = 0;
                bVar9 = true;
              }
              else {
LAB_00117cf4:
                bVar9 = false;
              }
              if (bVar9) goto LAB_00117c45;
            }
          }
          else {
            if (pHVar17->_cascadeModel == IC) {
              pvVar4 = (pHVar17->_graph->
                       super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              ppVar5 = *(pointer *)
                        ((long)&pvVar4[uVar2].
                                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                ._M_impl.super__Vector_impl_data + 8);
              uVar13 = local_a0;
              lVar11 = local_78;
              uVar14 = local_68;
              for (ppVar20 = pvVar4[uVar2].
                             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; local_78 = lVar21,
                  local_a0 = uVar18, local_68 = uVar19, ppVar20 != ppVar5; ppVar20 = ppVar20 + 1) {
                uVar2 = ppVar20->first;
                uVar19 = 1L << ((byte)uVar2 & 0x3f);
                uVar18 = (ulong)(uVar2 >> 6);
                uVar15 = 9;
                if (((pHVar17->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar18] >>
                     ((ulong)uVar2 & 0x3f) & 1) == 0) {
                  if (0x17d < dsfmt_global_data.idx) {
                    dsfmt_gen_rand_all(&dsfmt_global_data);
                    dsfmt_global_data.idx = 0;
                    pHVar17 = local_98;
                  }
                  lVar21 = (long)dsfmt_global_data.idx;
                  dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
                  if (2.0 - dsfmt_global_data.status[0].d[lVar21] <= (double)ppVar20->second) {
                    if ((*(ulong *)(local_88._0_8_ + uVar18 * 8) & uVar19) == 0) {
                      (pHVar17->__vecVisitNode).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[local_a0] = uVar2;
                      local_a0 = local_a0 + 1;
                      puVar1 = (pHVar17->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>.
                               _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                               _M_p + uVar18;
                      *puVar1 = *puVar1 | uVar19;
                      uVar15 = 0;
                    }
                    else {
                      local_78 = local_78 + 1;
                      uVar15 = 10;
                    }
                  }
                }
                uVar19 = local_68;
                uVar18 = local_a0;
                lVar21 = local_78;
                if ((uVar15 != 9) && (uVar15 != 0)) goto LAB_00117c3f;
                uVar13 = local_a0;
                lVar11 = local_78;
                uVar14 = local_68;
              }
              uVar15 = 8;
              uVar19 = local_68;
              uVar18 = local_a0;
              lVar21 = local_78;
              local_a0 = uVar13;
              local_78 = lVar11;
              local_68 = uVar14;
LAB_00117c3f:
              if (uVar15 != 8) goto LAB_00117c48;
            }
LAB_00117c45:
            uVar15 = 0;
          }
LAB_00117c48:
          if (uVar15 < 6) {
            if (uVar15 != 0) goto LAB_00117d57;
          }
          else if (uVar15 != 6) {
            if ((uVar15 != 7) && (uVar15 != 10)) goto LAB_00117d57;
            break;
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < uVar18);
        if (uVar18 != 0) {
          p_Var6 = (pHVar17->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          puVar7 = (pHVar17->__vecVisitNode).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar19 = 0;
          do {
            uVar2 = puVar7[uVar19];
            bVar8 = (byte)uVar2 & 0x3f;
            puVar1 = p_Var6 + (uVar2 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
            uVar19 = uVar19 + 1;
          } while (uVar18 != uVar19);
        }
      }
      else {
        lVar21 = lVar21 + 1;
      }
LAB_00117d57:
      lVar11 = local_60 + 1;
      auVar23._8_4_ = (int)((ulong)lVar21 >> 0x20);
      auVar23._0_8_ = lVar21;
      auVar23._12_4_ = 0x45300000;
      dVar25 = auVar23._8_8_ - 1.9342813113834067e+25;
      dVar22 = dVar25 + ((double)CONCAT44(0x43300000,(int)lVar21) - 4503599627370496.0);
    } while (dVar22 < local_70);
    auVar24._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar24._0_8_ = lVar11;
    auVar24._12_4_ = 0x45300000;
    dStack_90 = auVar24._8_8_ - 1.9342813113834067e+25;
    dVar26 = dStack_90 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  }
  uVar2 = pHVar17->__numV;
  local_98 = (HyperGraph *)dVar26;
  local_88._0_8_ = dVar22;
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    local_88._8_4_ = SUB84(dVar25,0);
    local_88._12_4_ = (int)((ulong)dVar25 >> 0x20);
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return ((double)local_88._0_8_ * (double)uVar2) / (double)local_98;
}

Assistant:

double effic_inf_valid_algo(const Nodelist& vecSeed, const double delta = 1e-3, const double eps = 0.01)
    {
        const double c = 2.0 * (exp(1.0) - 2.0);
        const double LambdaL = 1.0 + 2.0 * c * (1.0 + eps) * log(2.0 / delta) / (eps * eps);
        size_t numHyperEdge = 0;
        size_t numCoverd = 0;
        std::vector<bool> vecBoolSeed(__numV);
        for (auto seed : vecSeed) vecBoolSeed[seed] = true;

        while (numCoverd < LambdaL)
        {
            numHyperEdge++;
            size_t numVisitNode = 0, currIdx = 0;
            const auto uStart = dsfmt_gv_genrand_uint32_range(__numV);
            if (vecBoolSeed[uStart])
            {
                // Stop, this sample is covered
                numCoverd++;
                continue;
            }
            __vecVisitNode[numVisitNode++] = uStart;
            __vecVisitBool[uStart] = true;
            while (currIdx < numVisitNode)
            {
                const auto expand = __vecVisitNode[currIdx++];
                if (_cascadeModel == IC)
                {
                    for (auto& nbr : _graph[expand])
                    {
                        const auto nbrId = nbr.first;
                        if (__vecVisitBool[nbrId])
                            continue;
                        const auto randDouble = dsfmt_gv_genrand_open_close();
                        if (randDouble > nbr.second)
                            continue;
                        if (vecBoolSeed[nbrId])
                        {
                            // Stop, this sample is covered
                            numCoverd++;
                            goto postProcess;
                        }
                        __vecVisitNode[numVisitNode++] = nbrId;
                        __vecVisitBool[nbrId] = true;
                    }
                }
                else if (_cascadeModel == LT)
                {
                    if (_graph[expand].size() == 0)
                        continue;
                    const auto nextNbrIdx = gen_random_node_by_weight_LT(_graph[expand]);
                    if (nextNbrIdx >= _graph[expand].size()) break; // No element activated
                    const auto nbrId = _graph[expand][nextNbrIdx].first;
                    if (__vecVisitBool[nbrId]) break; // Stop, no further node activated
                    if (vecBoolSeed[nbrId])
                    {
                        // Stop, this sample is covered
                        numCoverd++;
                        goto postProcess;
                    }
                    __vecVisitNode[numVisitNode++] = nbrId;
                    __vecVisitBool[nbrId] = true;
                }
            }
            postProcess:
            for (auto i = 0; i < numVisitNode; i++)
                __vecVisitBool[__vecVisitNode[i]] = false;
        }
        return 1.0 * numCoverd * __numV / numHyperEdge;
    }